

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O3

int flatcc_verify_table_as_typed_root
              (void *buf,size_t bufsiz,flatbuffers_thash_t thash,flatcc_table_verifier_f *tvf)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  flatcc_table_verifier_descriptor_t local_28;
  
  local_28.end = (flatbuffers_uoffset_t)bufsiz;
  iVar1 = 5;
  if ((((((ulong)buf & 3) == 0) && (iVar1 = 6, bufsiz >> 3 < 0x1fffffff)) && (iVar1 = 1, 7 < bufsiz)
      ) && ((thash == 0 || (iVar1 = 2, *(flatbuffers_thash_t *)((long)buf + 4) == thash)))) {
    local_28.table = *buf;
    uVar2 = (ulong)local_28.table;
    local_28.ttl = 99;
    iVar1 = 0xf;
    if ((uVar2 != 0) && ((local_28.table & 3) == 0 && uVar2 + 4 <= bufsiz)) {
      uVar3 = local_28.table - *(int *)((long)buf + uVar2);
      uVar2 = (ulong)uVar3;
      iVar1 = 0x1d;
      if ((uVar3 & 1) == 0 && -1 < (int)uVar3) {
        iVar1 = 0x1b;
        if (uVar2 + 2 <= bufsiz) {
          local_28.vsize = *(ushort *)((long)buf + uVar2);
          iVar1 = 0x1e;
          if (((local_28.vsize & 1) == 0 && uVar3 + local_28.vsize <= local_28.end) &&
             (iVar1 = 0x1c, 3 < local_28.vsize)) {
            local_28.tsize = *(ushort *)((long)buf + uVar2 + 2);
            iVar1 = 0x14;
            if ((uint)local_28.tsize <= local_28.end - local_28.table) {
              local_28.vtable = (void *)(uVar2 + (long)buf);
              local_28.buf = buf;
              iVar1 = (*tvf)(&local_28);
            }
          }
        }
      }
    }
    return iVar1;
  }
  return iVar1;
}

Assistant:

int flatcc_verify_table_as_typed_root(const void *buf, size_t bufsiz, flatbuffers_thash_t thash, flatcc_table_verifier_f *tvf)
{
    check_result(flatcc_verify_typed_buffer_header(buf, bufsiz, thash));
    return verify_table(buf, (uoffset_t)bufsiz, 0, read_uoffset(buf, 0), FLATCC_VERIFIER_MAX_LEVELS, tvf);
}